

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseSignal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_SignalType_t SigType)

{
  int iVar1;
  int local_444;
  int local_440;
  int local_43c;
  int i;
  int Limit;
  int Bit;
  int nLsb;
  int nMsb;
  char *pWord;
  char local_418 [7];
  char Symbol;
  char Buffer [1000];
  Ver_Stream_t *p;
  Ver_SignalType_t SigType_local;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  Buffer._992_8_ = pMan->pReader;
  Limit = -1;
  Bit = -1;
  do {
    do {
      _nLsb = Ver_ParseGetName(pMan);
      if (_nLsb == (char *)0x0) {
        return 0;
      }
      iVar1 = strcmp(_nLsb,"wire");
    } while (iVar1 == 0);
    if ((*_nLsb == '[') && (pMan->fNameLast == 0)) {
      if ((Bit != -1) || (Limit != -1)) {
        __assert_fail("nMsb == -1 && nLsb == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x338,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
      }
      Ver_ParseSignalPrefix(pMan,(char **)&nLsb,&Bit,&Limit);
      if ((*_nLsb == '\0') && (_nLsb = Ver_ParseGetName(pMan), _nLsb == (char *)0x0)) {
        return 0;
      }
    }
    if ((Bit == -1) && (Limit == -1)) {
      if ((SigType == VER_SIG_INPUT) || (SigType == VER_SIG_INOUT)) {
        Ver_ParseCreatePi(pNtk,_nLsb);
      }
      if ((SigType == VER_SIG_OUTPUT) || (SigType == VER_SIG_INOUT)) {
        Ver_ParseCreatePo(pNtk,_nLsb);
      }
      if ((SigType == VER_SIG_WIRE) || (SigType == VER_SIG_REG)) {
        Abc_NtkFindOrCreateNet(pNtk,_nLsb);
      }
    }
    else {
      if ((Bit < 0) || (Limit < 0)) {
        __assert_fail("nMsb >= 0 && nLsb >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x350,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
      }
      Ver_ParseInsertsSuffix(pMan,_nLsb,Bit,Limit);
      if (Limit < Bit) {
        local_440 = Bit - Limit;
      }
      else {
        local_440 = Limit - Bit;
      }
      local_440 = local_440 + 1;
      local_43c = 0;
      i = Limit;
      while (local_43c < local_440) {
        if (local_440 < 2) {
          sprintf(local_418,"%s",_nLsb);
        }
        else {
          sprintf(local_418,"%s[%d]",_nLsb,(ulong)(uint)i);
        }
        if ((SigType == VER_SIG_INPUT) || (SigType == VER_SIG_INOUT)) {
          Ver_ParseCreatePi(pNtk,local_418);
        }
        if ((SigType == VER_SIG_OUTPUT) || (SigType == VER_SIG_INOUT)) {
          Ver_ParseCreatePo(pNtk,local_418);
        }
        if ((SigType == VER_SIG_WIRE) || (SigType == VER_SIG_REG)) {
          Abc_NtkFindOrCreateNet(pNtk,local_418);
        }
        local_43c = local_43c + 1;
        if (Limit < Bit) {
          local_444 = i + 1;
        }
        else {
          local_444 = i + -1;
        }
        i = local_444;
      }
    }
    pWord._7_1_ = Ver_StreamPopChar((Ver_Stream_t *)Buffer._992_8_);
    if (pWord._7_1_ != ',') {
      if (pWord._7_1_ == ';') {
        return 1;
      }
      sprintf(pMan->sError,"Cannot parse signal line (expected , or ;).");
      Ver_ParsePrintErrorMessage(pMan);
      return 0;
    }
    pWord._7_1_ = 0x2c;
  } while( true );
}

Assistant:

int Ver_ParseSignal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_SignalType_t SigType )
{
    Ver_Stream_t * p = pMan->pReader;
    char Buffer[1000], Symbol, * pWord;
    int nMsb, nLsb, Bit, Limit, i;
    nMsb = nLsb = -1;
    while ( 1 )
    {
        // get the next word
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;

        if ( !strcmp(pWord, "wire") )
            continue;

        // check if the range is specified
        if ( pWord[0] == '[' && !pMan->fNameLast )
        {
            assert( nMsb == -1 && nLsb == -1 );
            Ver_ParseSignalPrefix( pMan, &pWord, &nMsb, &nLsb );
            // check the case when there is space between bracket and the next word
            if ( *pWord == 0 )
            {
                // get the signal name
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;
            }
        }

        // create signals
        if ( nMsb == -1 && nLsb == -1 )
        {
            if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePi( pNtk, pWord );
            if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePo( pNtk, pWord );
            if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                Abc_NtkFindOrCreateNet( pNtk, pWord );
        }
        else
        {
            assert( nMsb >= 0 && nLsb >= 0 );
            // add to the hash table
            Ver_ParseInsertsSuffix( pMan, pWord, nMsb, nLsb );
            // add signals from Lsb to Msb
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
//                sprintf( Buffer, "%s[%d]", pWord, Bit );
                if ( Limit > 1 )
                    sprintf( Buffer, "%s[%d]", pWord, Bit );
                else
                    sprintf( Buffer, "%s", pWord );
                if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePi( pNtk, Buffer );
                if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePo( pNtk, Buffer );
                if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                    Abc_NtkFindOrCreateNet( pNtk, Buffer );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
        break;
    }
    sprintf( pMan->sError, "Cannot parse signal line (expected , or ;)." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}